

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O2

void __thiscall re2c::SwitchIf::SwitchIf(SwitchIf *this,Span *sp,uint32_t nsp,State *next)

{
  opt_t *poVar1;
  Cases *this_00;
  
  this->type = IF;
  (this->info).cases = (Cases *)0x0;
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if ((nsp < 3) || (poVar1->sFlag != false)) {
    if (nsp < 9) {
      if (nsp < 6) {
        this_00 = (Cases *)operator_new(0x10);
        If::If((If *)this_00,LINEAR,sp,nsp,next);
        goto LAB_0012a6a7;
      }
    }
    else if (sp[nsp - 2].ub - sp->ub <= (nsp - 2) * 3) goto LAB_0012a626;
    this_00 = (Cases *)operator_new(0x10);
    If::If((If *)this_00,BINARY,sp,nsp,next);
  }
  else {
LAB_0012a626:
    this->type = SWITCH;
    this_00 = (Cases *)operator_new(0x18);
    Cases::Cases(this_00,sp,nsp);
  }
LAB_0012a6a7:
  (this->info).cases = this_00;
  return;
}

Assistant:

SwitchIf::SwitchIf (const Span * sp, uint32_t nsp, const State * next)
	: type (IF)
	, info ()
{
	if ((!opts->sFlag && nsp > 2) || (nsp > 8 && (sp[nsp - 2].ub - sp[0].ub <= 3 * (nsp - 2))))
	{
		type = SWITCH;
		info.cases = new Cases (sp, nsp);
	}
	else if (nsp > 5)
	{
		info.ifs = new If (If::BINARY, sp, nsp, next);
	}
	else
	{
		info.ifs = new If (If::LINEAR, sp, nsp, next);
	}
}